

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

int beagleSetRootPrePartials(int instance,int *bufferIndices,int *stateFrequenciesIndices,int count)

{
  pointer ppBVar1;
  BeagleImpl *pBVar2;
  int iVar3;
  
  ppBVar1 = (instances->
            super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  iVar3 = -4;
  if (((ulong)(long)instance <=
       (ulong)((long)(instances->
                     super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3)) &&
     (pBVar2 = ppBVar1[instance], pBVar2 != (BeagleImpl *)0x0)) {
    iVar3 = (**(code **)(*(long *)pBVar2 + 0x40))();
  }
  return iVar3;
}

Assistant:

BeagleImpl* getBeagleInstance(int instanceIndex) {
    if (instanceIndex > instances->size())
        return NULL;
    return (*instances)[instanceIndex];
}